

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::
HeapDisposer<kj::_::AttachmentPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>::
disposeImpl(HeapDisposer<kj::_::AttachmentPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
            *this,void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  long *plVar3;
  
  if (pointer != (void *)0x0) {
    AttachmentPromiseNodeBase::dropDependency((AttachmentPromiseNodeBase *)pointer);
    lVar1 = *(long *)((long)pointer + 0x18);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x20);
      *(undefined8 *)((long)pointer + 0x18) = 0;
      *(undefined8 *)((long)pointer + 0x20) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x28))
                (*(undefined8 **)((long)pointer + 0x28),lVar1,0x88,uVar2,uVar2,0);
    }
    *(undefined ***)pointer = &PTR_onReady_0064c720;
    plVar3 = *(long **)((long)pointer + 0x10);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    operator_delete(pointer,0x30);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }